

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector2.h
# Opt level: O2

void __thiscall chrono::ChVector2<double>::ArchiveIN(ChVector2<double> *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChVector2<double>>(marchive);
  local_30._name = "x";
  local_30._flags = '\0';
  local_30._value = this->m_data;
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = this->m_data + 1;
  local_48._name = "y";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

inline void ChVector2<Real>::ArchiveIN(ChArchiveIn& marchive) {
    // suggested: use versioning
    /*int version =*/ marchive.VersionRead<ChVector2<double>>();  // must use specialized template (any)
    // stream in all member m_data
    marchive >> CHNVP(m_data[0], "x");
    marchive >> CHNVP(m_data[1], "y");
}